

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O1

void Map_MappingSetupTruthTables(uint (*uTruths) [2])

{
  int m;
  long lVar1;
  
  m = 0;
  do {
    lVar1 = 0;
    do {
      if (((uint)m >> ((uint)lVar1 & 0x1f) & 1) != 0) {
        uTruths[lVar1][0] = uTruths[lVar1][0] | 1 << ((byte)m & 0x1f);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 5);
    m = m + 1;
  } while (m != 0x20);
  lVar1 = 0;
  do {
    uTruths[lVar1][1] = uTruths[lVar1][0];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  uTruths[5] = (uint  [2])0xffffffff00000000;
  return;
}

Assistant:

void Map_MappingSetupTruthTables( unsigned uTruths[][2] )
{
    int m, v;
    // set up the truth tables
    for ( m = 0; m < 32; m++ )
        for ( v = 0; v < 5; v++ )
            if ( m & (1 << v) )
                uTruths[v][0] |= (1 << m);
    // make adjustments for the case of 6 variables
    for ( v = 0; v < 5; v++ )
        uTruths[v][1] = uTruths[v][0];
    uTruths[5][0] = 0;
    uTruths[5][1] = MAP_FULL;
}